

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_date(lua_State *L)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *local_20a0;
  char *buff;
  size_t reslen;
  luaL_Buffer b;
  tm *ptStack_60;
  char cc [4];
  tm *stm;
  tm tmr;
  time_t t;
  char *s;
  lua_State *L_local;
  
  t = (time_t)luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    local_20a0 = (char *)time((time_t *)0x0);
  }
  else {
    local_20a0 = (char *)l_checktime(L,2);
  }
  tmr.__tm_zone = local_20a0;
  if (*(char *)t == '!') {
    ptStack_60 = (tm *)gmtime((time_t *)&tmr.__tm_zone);
    t = t + 1;
  }
  else {
    ptStack_60 = (tm *)localtime((time_t *)&tmr.__tm_zone);
  }
  if (ptStack_60 == (tm *)0x0) {
    luaL_error(L,"time result cannot be represented in this installation");
  }
  iVar1 = strcmp((char *)t,"*t");
  if (iVar1 == 0) {
    lua_createtable(L,0,9);
    setallfields(L,ptStack_60);
  }
  else {
    b.initb[0x1ffc] = '%';
    luaL_buffinit(L,(luaL_Buffer *)&reslen);
    while (*(char *)t != '\0') {
      if (*(char *)t == '%') {
        __s = luaL_prepbuffsize((luaL_Buffer *)&reslen,0xfa);
        t = (time_t)checkoption(L,(char *)(t + 1),b.initb + 0x1ffd);
        sVar2 = strftime(__s,0xfa,b.initb + 0x1ffc,(tm *)ptStack_60);
        b.size = sVar2 + b.size;
      }
      else {
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)&reslen,1);
        }
        *(undefined1 *)(reslen + b.size) = *(undefined1 *)t;
        b.size = b.size + 1;
        t = t + 1;
      }
    }
    luaL_pushresult((luaL_Buffer *)&reslen);
  }
  return 1;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    luaL_error(L, "time result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s = checkoption(L, s + 1, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}